

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution_test_util.cc
# Opt level: O0

ostream * absl::lts_20240722::random_internal::operator<<(ostream *os,DistributionMoments *moments)

{
  ostream *poVar1;
  double *args;
  double local_50;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848>
  local_48;
  lts_20240722 local_38 [32];
  DistributionMoments *local_18;
  DistributionMoments *moments_local;
  ostream *os_local;
  
  local_18 = moments;
  moments_local = (DistributionMoments *)os;
  str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848,_(absl::lts_20240722::FormatConversionCharSet)654848>
  ::FormatSpecTemplate(&local_48,"mean=%f, stddev=%f, skewness=%f, kurtosis=%f");
  args = &local_18->mean;
  local_50 = sqrt(local_18->variance);
  StrFormat<double,_double,_double,_double>
            (local_38,&local_48,args,&local_50,&local_18->skewness,&local_18->kurtosis);
  poVar1 = std::operator<<(os,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const DistributionMoments& moments) {
  return os << absl::StrFormat("mean=%f, stddev=%f, skewness=%f, kurtosis=%f",
                               moments.mean, std::sqrt(moments.variance),
                               moments.skewness, moments.kurtosis);
}